

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarization.cpp
# Opt level: O0

binarization * __thiscall
pobr::imgProcessing::utils::binarization::binarizeImage(binarization *this,Mat *img,uint *threshold)

{
  uint *img_00;
  anon_class_24_3_0c4ae635 local_60;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&)> local_48;
  undefined1 local_21;
  uint *local_20;
  uint *threshold_local;
  Mat *img_local;
  Mat *resultImg;
  
  local_21 = 0;
  local_20 = threshold;
  threshold_local = (uint *)img;
  img_local = (Mat *)this;
  cv::Mat::clone();
  img_00 = threshold_local;
  local_60.img = (Mat *)threshold_local;
  local_60.threshold = local_20;
  local_60.resultImg = (Mat *)this;
  std::function<void(unsigned_long_const&,unsigned_long_const&)>::
  function<pobr::imgProcessing::utils::binarization::binarizeImage(cv::Mat_const&,unsigned_int_const&)::__0,void>
            ((function<void(unsigned_long_const&,unsigned_long_const&)> *)&local_48,&local_60);
  matrixOps::forEachPixel((Mat *)img_00,&local_48);
  std::function<void_(const_unsigned_long_&,_const_unsigned_long_&)>::~function(&local_48);
  return this;
}

Assistant:

cv::Mat
binarization::binarizeImage(const cv::Mat& img, const unsigned int& threshold)
{
    auto resultImg = img.clone();

    matrixOps::forEachPixel(
        img,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            auto& thisPixel = img.at<cv::Vec3b>(y, x);

            uint8_t value;

            if (thisPixel[0] > threshold && thisPixel[1] > threshold && thisPixel[2] > threshold)
            {
                value = 255;
            }
            else
            {
                value = 0;
            }

            resultImg.at<cv::Vec3b>(y, x)[0] = value;
            resultImg.at<cv::Vec3b>(y, x)[1] = value;
            resultImg.at<cv::Vec3b>(y, x)[2] = value;
        }
    );

    return resultImg;
}